

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_MappingRef::AddMappingChannel(ON_MappingRef *this,int mapping_channel_id,ON_UUID *mapping_id)

{
  undefined8 uVar1;
  ON_MappingChannel *pOVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ON_MappingChannel *pOVar8;
  long lVar9;
  ON_MappingChannel *b;
  ON_Xform *pOVar10;
  ON_Xform *pOVar11;
  bool bVar12;
  byte bVar13;
  
  bVar13 = 0;
  uVar6 = (this->m_mapping_channels).m_count;
  if (0 < (int)uVar6) {
    pOVar8 = (this->m_mapping_channels).m_a;
    if (pOVar8->m_mapping_channel_id == mapping_channel_id) {
      bVar12 = false;
      b = pOVar8;
    }
    else {
      do {
        uVar6 = uVar6 - 1;
        bVar12 = uVar6 == 0;
        if (bVar12) goto LAB_004e7234;
        b = pOVar8 + 1;
        pOVar2 = pOVar8 + 1;
        pOVar8 = b;
      } while (pOVar2->m_mapping_channel_id != mapping_channel_id);
    }
    iVar7 = ON_UuidCompare(mapping_id,&b->m_mapping_id);
    uVar6 = (uint)(iVar7 == 0);
LAB_004e7234:
    bVar5 = (byte)uVar6;
    if (!bVar12) goto LAB_004e726a;
  }
  pOVar8 = ON_SimpleArray<ON_MappingChannel>::AppendNew(&this->m_mapping_channels);
  pOVar8->m_mapping_channel_id = mapping_channel_id;
  uVar3 = mapping_id->Data2;
  uVar4 = mapping_id->Data3;
  uVar1 = *(undefined8 *)mapping_id->Data4;
  (pOVar8->m_mapping_id).Data1 = mapping_id->Data1;
  (pOVar8->m_mapping_id).Data2 = uVar3;
  (pOVar8->m_mapping_id).Data3 = uVar4;
  *(undefined8 *)(pOVar8->m_mapping_id).Data4 = uVar1;
  pOVar8->m_mapping_index = -1;
  pOVar10 = &ON_Xform::IdentityTransformation;
  pOVar11 = &pOVar8->m_object_xform;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
    pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar11 = (ON_Xform *)((long)pOVar11 + (ulong)bVar13 * -0x10 + 8);
  }
  bVar5 = 1;
LAB_004e726a:
  return (bool)(bVar5 & 1);
}

Assistant:

bool ON_MappingRef::AddMappingChannel(
        int mapping_channel_id,
        const ON_UUID& mapping_id
        )
{
  int i;
  if ( (i = m_mapping_channels.Count()) > 0 )
  {
    for ( const ON_MappingChannel* mc = m_mapping_channels.Array(); i--; mc++ )
    {
      if ( mapping_channel_id == mc->m_mapping_channel_id )
      {
        // a matching mapping channel id exists
        // return true if mapping_id matches
        return ( 0 == ON_UuidCompare(&mapping_id,&mc->m_mapping_id) );
      }
    }
  }

  ON_MappingChannel& mc   = m_mapping_channels.AppendNew();
  mc.m_mapping_channel_id = mapping_channel_id;
  mc.m_mapping_id         = mapping_id;
  mc.m_mapping_index      = -1; // 27th October 2011 John Croudy - constructor is not called by AppendNew().
  mc.m_object_xform = ON_Xform::IdentityTransformation;

  return true;
}